

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestSpec::serializeTo(TestSpec *this,ostream *out)

{
  bool bVar1;
  const_iterator out_00;
  ostream *in_RSI;
  Filter *filter;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *__range1;
  bool first;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
  local_28 [2];
  byte local_11;
  ostream *local_10;
  
  local_11 = 1;
  local_10 = in_RSI;
  local_28[0]._M_current =
       (Filter *)
       std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::begin
                 ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
                  in_stack_ffffffffffffffc8);
  out_00 = std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::end
                     ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
                      in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                        *)out_00._M_current,
                       (__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
         ::operator*(local_28);
    if ((local_11 & 1) == 0) {
      std::operator<<(local_10,',');
    }
    Catch::operator<<((ostream *)out_00._M_current,in_stack_ffffffffffffffc8);
    local_11 = 0;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
    ::operator++(local_28);
  }
  return;
}

Assistant:

void TestSpec::serializeTo( std::ostream& out ) const {
        bool first = true;
        for ( auto const& filter : m_filters ) {
            if ( !first ) {
                out << ',';
            }
            out << filter;
            first = false;
        }
    }